

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLsBandDQJac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,ARKodeMem ark_mem,
                  ARKLsMem arkls_mem,ARKRhsFn fi,N_Vector tmp1,N_Vector tmp2)

{
  int iVar1;
  sunindextype sVar2;
  sunindextype sVar3;
  sunindextype sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  sunrealtype *psVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long j;
  sunindextype sVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double local_d8;
  long local_c0;
  double local_b8;
  long local_b0;
  
  sVar2 = SUNBandMatrix_Columns(Jac);
  sVar3 = SUNBandMatrix_UpperBandwidth(Jac);
  sVar4 = SUNBandMatrix_LowerBandwidth(Jac);
  lVar5 = N_VGetArrayPointer(ark_mem->ewt);
  lVar6 = N_VGetArrayPointer(fy);
  lVar7 = N_VGetArrayPointer(tmp1);
  lVar8 = N_VGetArrayPointer(y);
  lVar9 = N_VGetArrayPointer(tmp2);
  if (ark_mem->constraintsSet == 0) {
    local_c0 = 0;
  }
  else {
    local_c0 = N_VGetArrayPointer(ark_mem->constraints);
  }
  local_b8 = 1.0;
  N_VScale(y,tmp2);
  dVar21 = ark_mem->uround;
  local_d8 = 0.0;
  if (0.0 < dVar21) {
    if (dVar21 < 0.0) {
      local_d8 = sqrt(dVar21);
    }
    else {
      local_d8 = SQRT(dVar21);
    }
  }
  dVar21 = (double)N_VWrmsNorm(fy,ark_mem->rwt);
  if ((dVar21 != 0.0) || (NAN(dVar21))) {
    local_b8 = dVar21 * (double)sVar2 * ABS(ark_mem->h) * 1000.0 * ark_mem->uround;
  }
  lVar14 = sVar3 + sVar4 + 1;
  sVar16 = sVar2;
  if (lVar14 < sVar2) {
    sVar16 = lVar14;
  }
  if (0 < sVar16) {
    lVar17 = -sVar3;
    local_b0 = 0;
    lVar10 = 1;
    do {
      j = lVar10 + -1;
      iVar1 = ark_mem->constraintsSet;
      lVar12 = j;
      do {
        dVar21 = ABS(*(double *)(lVar8 + lVar12 * 8)) * local_d8;
        dVar22 = local_b8 / *(double *)(lVar5 + lVar12 * 8);
        if (dVar21 <= dVar22) {
          dVar21 = dVar22;
        }
        if (iVar1 != 0) {
          dVar22 = *(double *)(local_c0 + lVar12 * 8);
          dVar23 = ABS(dVar22);
          if ((dVar23 != 1.0) || (NAN(dVar23))) {
            if ((dVar23 == 2.0) &&
               ((!NAN(dVar23) && (dVar22 * (*(double *)(lVar9 + lVar12 * 8) + dVar21) <= 0.0))))
            goto LAB_0013e0cc;
          }
          else if (dVar22 * (*(double *)(lVar9 + lVar12 * 8) + dVar21) < 0.0) {
LAB_0013e0cc:
            dVar21 = -dVar21;
          }
        }
        *(double *)(lVar9 + lVar12 * 8) = dVar21 + *(double *)(lVar9 + lVar12 * 8);
        lVar12 = lVar12 + lVar14;
      } while (lVar12 < sVar2);
      iVar1 = (*fi)(t,tmp2,tmp1,ark_mem->user_data);
      arkls_mem->nfeDQ = arkls_mem->nfeDQ + 1;
      lVar12 = local_b0;
      lVar18 = lVar17;
      if (iVar1 != 0) {
        return iVar1;
      }
      do {
        lVar19 = 0;
        if (0 < lVar18) {
          lVar19 = lVar18;
        }
        *(undefined8 *)(lVar9 + j * 8) = *(undefined8 *)(lVar8 + j * 8);
        psVar11 = SUNBandMatrix_Column(Jac,j);
        dVar22 = local_b8 / *(double *)(lVar5 + j * 8);
        dVar21 = ABS(*(double *)(lVar8 + j * 8)) * local_d8;
        if (dVar21 <= dVar22) {
          dVar21 = dVar22;
        }
        if (ark_mem->constraintsSet != 0) {
          dVar22 = *(double *)(local_c0 + j * 8);
          dVar23 = ABS(dVar22);
          if ((dVar23 != 1.0) || (NAN(dVar23))) {
            if ((dVar23 == 2.0) &&
               ((!NAN(dVar23) && (dVar22 * (*(double *)(lVar9 + j * 8) + dVar21) <= 0.0))))
            goto LAB_0013e221;
          }
          else if (dVar22 * (*(double *)(lVar9 + j * 8) + dVar21) < 0.0) {
LAB_0013e221:
            dVar21 = -dVar21;
          }
        }
        lVar15 = j - sVar3;
        if (lVar15 < 1) {
          lVar15 = 0;
        }
        lVar13 = sVar4 + j;
        if (sVar2 + -1 <= sVar4 + j) {
          lVar13 = sVar2 + -1;
        }
        if (lVar15 <= lVar13) {
          lVar19 = lVar19 + -1;
          do {
            *(double *)((long)psVar11 + lVar19 * 8 + lVar12 + 8) =
                 (*(double *)(lVar7 + 8 + lVar19 * 8) - *(double *)(lVar6 + 8 + lVar19 * 8)) *
                 (1.0 / dVar21);
            lVar19 = lVar19 + 1;
          } while (lVar19 < lVar13);
        }
        j = j + lVar14;
        lVar12 = lVar12 + ~(sVar3 + sVar4) * 8;
        lVar18 = lVar18 + lVar14;
      } while (j < sVar2);
      lVar17 = lVar17 + 1;
      local_b0 = local_b0 + -8;
      bVar20 = lVar10 != sVar16;
      lVar10 = lVar10 + 1;
    } while (bVar20);
  }
  return 0;
}

Assistant:

int arkLsBandDQJac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                   ARKodeMem ark_mem, ARKLsMem arkls_mem, ARKRhsFn fi,
                   N_Vector tmp1, N_Vector tmp2)
{
  N_Vector ftemp, ytemp;
  sunrealtype fnorm, minInc, inc, inc_inv, srur, conj;
  sunrealtype *col_j, *ewt_data, *fy_data, *ftemp_data, *y_data, *ytemp_data;
  sunrealtype* cns_data;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunindextype N, mupper, mlower;
  int retval = 0;

  /* access matrix dimensions */
  N      = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of y and f */
  ftemp = tmp1;
  ytemp = tmp2;

  /* Obtain pointers to the data for ewt, fy, ftemp, y, ytemp */
  ewt_data   = N_VGetArrayPointer(ark_mem->ewt);
  fy_data    = N_VGetArrayPointer(fy);
  ftemp_data = N_VGetArrayPointer(ftemp);
  y_data     = N_VGetArrayPointer(y);
  ytemp_data = N_VGetArrayPointer(ytemp);
  cns_data = (ark_mem->constraintsSet) ? N_VGetArrayPointer(ark_mem->constraints)
                                       : NULL;

  /* Load ytemp with y = predicted y vector */
  N_VScale(ONE, y, ytemp);

  /* Set minimum increment based on uround and norm of f */
  srur   = SUNRsqrt(ark_mem->uround);
  fnorm  = N_VWrmsNorm(fy, ark_mem->rwt);
  minInc = (fnorm != ZERO)
             ? (MIN_INC_MULT * SUNRabs(ark_mem->h) * ark_mem->uround * N * fnorm)
             : ONE;

  /* Set bandwidth and number of column groups for band differencing */
  width   = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  /* Loop over column groups. */
  for (group = 1; group <= ngroups; group++)
  {
    /* Increment all y_j in group */
    for (j = group - 1; j < N; j += width)
    {
      inc = SUNMAX(srur * SUNRabs(y_data[j]), minInc / ewt_data[j]);

      /* Adjust sign(inc) if yj has an inequality constraint. */
      if (ark_mem->constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((ytemp_data[j] + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((ytemp_data[j] + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      ytemp_data[j] += inc;
    }

    /* Evaluate f with incremented y */
    retval = fi(t, ytemp, ftemp, ark_mem->user_data);
    arkls_mem->nfeDQ++;
    if (retval != 0) { break; }

    /* Restore ytemp, then form and load difference quotients */
    for (j = group - 1; j < N; j += width)
    {
      ytemp_data[j] = y_data[j];
      col_j         = SUNBandMatrix_Column(Jac, j);
      inc           = SUNMAX(srur * SUNRabs(y_data[j]), minInc / ewt_data[j]);

      /* Adjust sign(inc) as before. */
      if (ark_mem->constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((ytemp_data[j] + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((ytemp_data[j] + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      inc_inv = ONE / inc;
      i1      = SUNMAX(0, j - mupper);
      i2      = SUNMIN(j + mlower, N - 1);
      for (i = i1; i <= i2; i++)
      {
        SM_COLUMN_ELEMENT_B(col_j, i, j) = inc_inv * (ftemp_data[i] - fy_data[i]);
      }
    }
  }

  return (retval);
}